

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer_combination_iterator.h
# Opt level: O3

void __thiscall
Gudhi::coxeter_triangulation::Integer_combination_iterator::
Integer_combination_iterator<Gudhi::coxeter_triangulation::Size_range<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
          (Integer_combination_iterator *this,uint *n,uint *k,
          Size_range<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *bounds)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint uVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer puVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  iterator iVar8;
  uint uVar9;
  ulong uVar10;
  pointer pvVar11;
  allocator_type local_4d;
  uint local_4c [3];
  uint *local_40;
  uint *local_38;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->value_,(ulong)(*k + 2),&local_4d);
  uVar1 = *k;
  this->is_end_ = uVar1 == 0 || *n == 0;
  this->k_ = uVar1;
  this_00 = &this->bounds_;
  (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(this_00,(ulong)(*k + 2));
  pvVar2 = (bounds->t_->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (bounds->t_->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_40 = k;
  local_38 = n;
  if (pvVar2 == pvVar3) {
    uVar7 = 0;
  }
  else {
    uVar10 = (long)(pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
    uVar7 = 0;
    while( true ) {
      pvVar11 = pvVar2 + 1;
      uVar9 = (int)(uVar10 >> 3) - 1;
      iVar8._M_current =
           (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_4c[2] = uVar9;
      if (iVar8._M_current ==
          (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (this_00,iVar8,local_4c + 2);
      }
      else {
        *iVar8._M_current = uVar9;
        (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar8._M_current + 1;
      }
      uVar7 = uVar7 + uVar9;
      if (pvVar11 == pvVar3) break;
      uVar10 = (long)pvVar2[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar11->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start;
      pvVar2 = pvVar11;
    }
  }
  local_4c[1] = 2;
  iVar8._M_current =
       (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar5 = (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar8._M_current == puVar5) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (this_00,iVar8,local_4c + 1);
    iVar8._M_current =
         (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar5 = (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar8._M_current = 2;
    iVar8._M_current = iVar8._M_current + 1;
    (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar8._M_current;
  }
  local_4c[0] = 1;
  if (iVar8._M_current == puVar5) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (this_00,iVar8,local_4c);
  }
  else {
    *iVar8._M_current = 1;
    (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar8._M_current + 1;
  }
  uVar9 = *local_38;
  if (uVar7 < uVar9) {
    this->is_end_ = true;
  }
  else {
    puVar4 = (this->value_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar7 = *puVar5;
    if (uVar9 < uVar7) {
      uVar10 = 0;
      uVar6 = 1;
    }
    else {
      uVar6 = 1;
      uVar10 = 0;
      do {
        puVar4[uVar10] = uVar7;
        uVar9 = uVar9 - puVar5[uVar10];
        uVar10 = (ulong)uVar6;
        uVar7 = puVar5[uVar10];
        uVar6 = uVar6 + 1;
      } while (uVar7 <= uVar9);
    }
    puVar4[uVar10] = uVar9;
    if (uVar6 < this->k_) {
      uVar10 = (ulong)uVar6;
      do {
        puVar4[uVar10] = 0;
        uVar10 = uVar10 + 1;
      } while (uVar10 < this->k_);
    }
    puVar4[*local_40] = 1;
    puVar4[*local_40 + 1] = 0;
  }
  return;
}

Assistant:

Integer_combination_iterator(const uint& n, const uint& k, const Bound_range& bounds)
	  : value_(k + 2), is_end_(n == 0 || k == 0), k_(k) {
    bounds_.reserve(k + 2);
    uint sum_radices = 0;
    for (auto b : bounds) {
      bounds_.push_back(b);
      sum_radices += b;
    }
    bounds_.push_back(2);
    bounds_.push_back(1);
    if (n > sum_radices) {
      is_end_ = true;
      return;
    }
    uint i = 0;
    uint s = n;
    while (s >= bounds_[i]) {
      value_[i] = bounds_[i];
      s -= bounds_[i];
      i++;
    }
    value_[i++] = s;

    while (i < k_) value_[i++] = 0;
    value_[k] = 1;
    value_[k + 1] = 0;
  }